

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>::
on_num(int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  basic_format_specs<char> *pbVar4;
  undefined1 auVar5 [16];
  unsigned___int128 uVar6;
  char cVar7;
  int iVar8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar9;
  _Alloc_hider _Var10;
  uint uVar11;
  ulong uVar12;
  size_type sVar13;
  long lVar14;
  uint uVar15;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  string groups;
  char digits [40];
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  ulong uVar16;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar7 == '\0') {
      on_dec(this);
    }
    else {
      puVar1 = &this->abs_value;
      uVar6 = *puVar1;
      uVar21 = *(ulong *)((long)&this->abs_value + 8);
      auVar5 = (undefined1  [16])*puVar1;
      auVar23 = (undefined1  [16])*puVar1;
      uVar12 = 1;
      if (((ulong)uVar6 < 10) <= uVar21) {
        uVar12 = 4;
        auVar22 = auVar23;
        do {
          uVar18 = auVar22._8_8_;
          uVar16 = auVar22._0_8_;
          iVar8 = (int)uVar12;
          if (uVar18 == 0 && (ulong)(99 < uVar16) <= -uVar18) {
            uVar12 = (ulong)(iVar8 - 2);
            goto LAB_0019aa0c;
          }
          if (uVar18 == 0 && (ulong)(999 < uVar16) <= -uVar18) {
            uVar12 = (ulong)(iVar8 - 1);
            goto LAB_0019aa0c;
          }
          if (uVar18 < (uVar16 < 10000)) goto LAB_0019aa0c;
          auVar22 = __udivti3(uVar16,uVar18,10000,0);
          uVar12 = (ulong)(iVar8 + 4);
        } while (uVar18 != 0 || -uVar18 < (ulong)(99999 < uVar16));
        uVar12 = (ulong)(iVar8 + 1);
      }
LAB_0019aa0c:
      pcVar19 = local_298._M_dataplus._M_p + local_298._M_string_length;
      uVar11 = (uint)uVar12;
      _Var10._M_p = local_298._M_dataplus._M_p;
      uVar18 = uVar12;
      uVar20 = uVar11;
      if (local_298._M_string_length != 0) {
        sVar13 = local_298._M_string_length;
        uVar16 = uVar12;
        do {
          uVar20 = (uint)uVar16;
          cVar3 = *_Var10._M_p;
          uVar15 = uVar20 - (int)cVar3;
          uVar16 = (ulong)uVar15;
          if ((uVar15 == 0 || (int)uVar20 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
          goto LAB_0019aa5b;
          uVar18 = (ulong)((int)uVar18 + 1);
          _Var10._M_p = _Var10._M_p + 1;
          sVar13 = sVar13 - 1;
        } while (sVar13 != 0);
        _Var10._M_p = pcVar19;
        uVar18 = (ulong)((int)local_298._M_string_length + uVar11);
        uVar20 = uVar15;
      }
LAB_0019aa5b:
      iVar8 = (int)uVar18;
      if (_Var10._M_p == pcVar19) {
        iVar8 = (int)(uVar20 - 1) / (int)pcVar19[-1] + iVar8;
      }
      pcVar19 = local_278 + (int)uVar11;
      pcVar17 = pcVar19;
      if (((ulong)uVar6 < 100) <= uVar21) {
        do {
          lVar14 = auVar23._8_8_;
          uVar21 = auVar23._0_8_;
          pcVar19 = pcVar17 + -2;
          auVar23 = __udivti3(uVar21,lVar14,100,0);
          *(undefined2 *)(pcVar17 + -2) =
               *(undefined2 *)(&basic_data<void>::digits + (uVar21 + auVar23._0_8_ * -100) * 2);
          pcVar17 = pcVar19;
          auVar5 = auVar23;
        } while (lVar14 != 0 || (ulong)-lVar14 < (ulong)(9999 < uVar21));
      }
      if (auVar5._8_8_ == 0 && (ulong)(9 < auVar5._0_8_) <= (ulong)-auVar5._8_8_) {
        pcVar19[-1] = auVar5[0] | 0x30;
      }
      else {
        *(undefined2 *)(pcVar19 + -2) =
             *(undefined2 *)(&basic_data<void>::digits + auVar5._0_8_ * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0032edd0;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar20 = iVar8 + this->prefix_size;
      uVar21 = (ulong)uVar20;
      if (500 < uVar20) {
        basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar21);
      }
      pcVar19 = local_248.super_buffer<char>.ptr_;
      local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
      if (uVar21 <= local_248.super_buffer<char>.capacity_) {
        local_248.super_buffer<char>.size_ = uVar21;
      }
      pcVar17 = local_248.super_buffer<char>.ptr_ + (long)(int)uVar20 + -1;
      if (1 < (int)uVar11) {
        lVar14 = uVar12 + 1;
        iVar8 = 0;
        _Var10._M_p = local_298._M_dataplus._M_p;
        do {
          pcVar2 = pcVar17 + -1;
          *pcVar17 = local_278[lVar14 + -2];
          cVar3 = *_Var10._M_p;
          if ('\0' < cVar3) {
            iVar8 = iVar8 + 1;
            if ((cVar3 != '\x7f') && (iVar8 % (int)cVar3 == 0)) {
              if (_Var10._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
                iVar8 = 0;
                _Var10._M_p = _Var10._M_p + 1;
              }
              pcVar17[-1] = cVar7;
              pcVar2 = pcVar17 + -2;
            }
          }
          pcVar17 = pcVar2;
          lVar14 = lVar14 + -1;
        } while (2 < lVar14);
      }
      *pcVar17 = local_278[0];
      if (this->prefix_size != 0) {
        pcVar17[-1] = 0x2d;
      }
      pbVar4 = this->specs;
      uVar12 = 0;
      if (uVar21 <= (uint)pbVar4->width) {
        uVar12 = (uint)pbVar4->width - uVar21;
      }
      uVar21 = uVar12 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                   (ulong)((byte)pbVar4->field_0x9 & 0xf)) & 0x3f);
      bVar9 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                        ((this->out).container,uVar21,&pbVar4->fill);
      bVar9 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                        (pcVar19,pcVar19 + (int)uVar20,bVar9);
      bVar9 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                        (bVar9,uVar12 - uVar21,&pbVar4->fill);
      (this->out).container = bVar9.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }